

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Cluster::QueueOrWriteFrame(Cluster *this,Frame *frame)

{
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *this_00;
  _List_node_base *p_Var1;
  Frame *frame_00;
  uint64_t uVar2;
  bool bVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer p_Var7;
  iterator current_track_iterator;
  uint64_t track_number;
  vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  frames_to_erase;
  Frame *frame_to_store;
  
  if ((frame == (Frame *)0x0) || (bVar3 = Frame::IsValid(frame), !bVar3)) {
    return false;
  }
  if (this->write_last_frame_with_duration_ == false) {
    bVar3 = DoWriteFrame(this,frame);
    return bVar3;
  }
  track_number = frame->track_number_;
  frame_to_store = (Frame *)operator_new(0x68);
  frame_to_store->frame_ = (uint8_t *)0x0;
  frame_to_store->is_key_ = false;
  frame_to_store->add_id_ = 0;
  frame_to_store->additional_ = (uint8_t *)0x0;
  frame_to_store->additional_length_ = 0;
  frame_to_store->duration_ = 0;
  frame_to_store->duration_set_ = false;
  frame_to_store->length_ = 0;
  frame_to_store->track_number_ = 0;
  frame_to_store->timestamp_ = 0;
  frame_to_store->discard_padding_ = 0;
  *(undefined8 *)((long)&frame_to_store->discard_padding_ + 1) = 0;
  *(undefined8 *)((long)&frame_to_store->reference_block_timestamp_ + 1) = 0;
  Frame::CopyFrom(frame_to_store,frame);
  this_00 = &this->stored_frames_;
  pmVar4 = std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::operator[](this_00,&track_number);
  std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::push_back
            (pmVar4,&frame_to_store);
  frames_to_erase.
  super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  frames_to_erase.
  super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frames_to_erase.
  super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar4 = std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::operator[](this_00,&track_number);
  p_Var6 = (pmVar4->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>)._M_impl
           ._M_node.super__List_node_base._M_next;
  current_track_iterator._M_node = p_Var6;
  pmVar4 = std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::operator[](this_00,&track_number);
  p_Var1 = (pmVar4->super__List_base<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>)._M_impl
           ._M_node.super__List_node_base._M_prev;
  do {
    uVar2 = track_number;
    if (p_Var6 == p_Var1) {
LAB_0011e320:
      for (p_Var7 = frames_to_erase.
                    super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var7 != frames_to_erase.
                    super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; p_Var7 = p_Var7 + 1) {
        pmVar4 = std::
                 map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                 ::operator[](this_00,&track_number);
        std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::erase
                  (pmVar4,p_Var7->_M_node);
      }
      bVar3 = true;
LAB_0011e34f:
      std::
      _Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
      ::~_Vector_base(&frames_to_erase.
                       super__Vector_base<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
                     );
      return bVar3;
    }
    frame_00 = (Frame *)p_Var6[1]._M_next;
    for (p_Var5 = (this->stored_frames_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->stored_frames_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if ((*(uint64_t *)(p_Var5 + 1) != uVar2) &&
         ((p_Var5[1]._M_parent)->_M_left[2]._M_parent < (_Base_ptr)frame_00->timestamp_))
      goto LAB_0011e320;
    }
    bVar3 = DoWriteFrame(this,frame_00);
    if (frame_00 != (Frame *)0x0) {
      Frame::~Frame(frame_00);
    }
    operator_delete(frame_00);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0011e34f;
    }
    std::
    vector<std::_List_iterator<mkvmuxer::Frame_*>,_std::allocator<std::_List_iterator<mkvmuxer::Frame_*>_>_>
    ::push_back(&frames_to_erase,&current_track_iterator);
    p_Var6 = (current_track_iterator._M_node)->_M_next;
    current_track_iterator._M_node = p_Var6;
  } while( true );
}

Assistant:

bool Cluster::QueueOrWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  // If |write_last_frame_with_duration_| is not set, then write the frame right
  // away.
  if (!write_last_frame_with_duration_) {
    return DoWriteFrame(frame);
  }

  // Queue the current frame.
  uint64_t track_number = frame->track_number();
  Frame* const frame_to_store = new Frame();
  frame_to_store->CopyFrom(*frame);
  stored_frames_[track_number].push_back(frame_to_store);

  // Iterate through all queued frames in the current track except the last one
  // and write it if it is okay to do so (i.e.) no other track has an held back
  // frame with timestamp <= the timestamp of the frame in question.
  std::vector<std::list<Frame*>::iterator> frames_to_erase;
  for (std::list<Frame*>::iterator
           current_track_iterator = stored_frames_[track_number].begin(),
           end = --stored_frames_[track_number].end();
       current_track_iterator != end; ++current_track_iterator) {
    const Frame* const frame_to_write = *current_track_iterator;
    bool okay_to_write = true;
    for (FrameMapIterator track_iterator = stored_frames_.begin();
         track_iterator != stored_frames_.end(); ++track_iterator) {
      if (track_iterator->first == track_number) {
        continue;
      }
      if (track_iterator->second.front()->timestamp() <
          frame_to_write->timestamp()) {
        okay_to_write = false;
        break;
      }
    }
    if (okay_to_write) {
      const bool wrote_frame = DoWriteFrame(frame_to_write);
      delete frame_to_write;
      if (!wrote_frame)
        return false;
      frames_to_erase.push_back(current_track_iterator);
    } else {
      break;
    }
  }
  for (std::vector<std::list<Frame*>::iterator>::iterator iterator =
           frames_to_erase.begin();
       iterator != frames_to_erase.end(); ++iterator) {
    stored_frames_[track_number].erase(*iterator);
  }
  return true;
}